

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

QWidget * __thiscall QLayout::parentWidget(QLayout *this)

{
  QWidget *object;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    object = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
    if ((*(byte *)(*(long *)&this->field_0x8 + 0x8c) & 1) != 0) goto LAB_002e2cf2;
    if (object == (QWidget *)0x0) {
      object = (QWidget *)0x0;
      goto LAB_002e2cf2;
    }
    this = QtPrivate::qobject_cast_helper<QLayout*,QObject>(&object->super_QObject);
  } while (this != (QLayout *)0x0);
  local_30[0] = '\x02';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[0x14] = '\0';
  local_30[0x15] = '\0';
  local_30[0x16] = '\0';
  local_30[0x17] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[10] = '\0';
  local_30[0xb] = '\0';
  local_30[0xc] = '\0';
  local_30[0xd] = '\0';
  local_30[0xe] = '\0';
  local_30[0xf] = '\0';
  local_30[0x10] = '\0';
  local_30[0x11] = '\0';
  local_30[0x12] = '\0';
  local_30[0x13] = '\0';
  local_18 = "default";
  object = (QWidget *)0x0;
  QMessageLogger::warning
            (local_30,"QLayout::parentWidget: A layout can only have another layout as a parent.");
LAB_002e2cf2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return object;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QLayout::parentWidget() const
{
    Q_D(const QLayout);
    if (!d->topLevel) {
        if (parent()) {
            QLayout *parentLayout = qobject_cast<QLayout*>(parent());
            if (Q_UNLIKELY(!parentLayout)) {
                qWarning("QLayout::parentWidget: A layout can only have another layout as a parent.");
                return nullptr;
            }
            return parentLayout->parentWidget();
        } else {
            return nullptr;
        }
    } else {
        Q_ASSERT(parent() && parent()->isWidgetType());
        return static_cast<QWidget *>(parent());
    }
}